

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_disk_io.cpp
# Opt level: O2

storage_holder __thiscall
libtorrent::posix_disk_io::new_torrent
          (posix_disk_io *this,storage_params *params,shared_ptr<void> *param_2)

{
  unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
  __p;
  storage_index_t sVar1;
  __uniq_ptr_data<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>,_true,_true>
  in_RAX;
  undefined8 extraout_RDX;
  storage_holder sVar2;
  __single_object storage;
  _Head_base<0UL,_libtorrent::aux::posix_storage_*,_false> local_28;
  
  local_28._M_head_impl =
       (posix_storage *)
       in_RAX.
       super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::posix_storage_*,_std::default_delete<libtorrent::aux::posix_storage>_>
       .super__Head_base<0UL,_libtorrent::aux::posix_storage_*,_false>._M_head_impl;
  sVar1 = aux::storage_free_list::new_index
                    ((storage_free_list *)&params->priorities,
                     (uint)((ulong)((long)params->path - (long)params->mapped_files) >> 3));
  ::std::make_unique<libtorrent::aux::posix_storage,libtorrent::storage_params_const&>
            ((storage_params *)&stack0xffffffffffffffd8);
  __p._M_t.
  super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::posix_storage_*,_std::default_delete<libtorrent::aux::posix_storage>_>
  .super__Head_base<0UL,_libtorrent::aux::posix_storage_*,_false>._M_head_impl =
       (__uniq_ptr_data<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>,_true,_true>
        )(__uniq_ptr_data<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>,_true,_true>
          )local_28._M_head_impl;
  if (sVar1.m_val == (uint)((ulong)((long)params->path - (long)params->mapped_files) >> 3)) {
    ::std::
    vector<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>,std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>>>
    ::
    emplace_back<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>>
              ((vector<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>,std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>>>
                *)&params->mapped_files,
               (unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
                *)&stack0xffffffffffffffd8);
  }
  else {
    local_28._M_head_impl = (posix_storage *)0x0;
    ::std::
    __uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
    ::reset((__uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
             *)(&params->mapped_files->m_piece_length + (ulong)sVar1.m_val * 2),
            (pointer)__p._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::posix_storage_*,_std::default_delete<libtorrent::aux::posix_storage>_>
                     .super__Head_base<0UL,_libtorrent::aux::posix_storage_*,_false>._M_head_impl);
  }
  (this->super_disk_interface)._vptr_disk_interface = (_func_int **)params;
  *(uint *)&(this->m_torrents).
            super_vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
            .
            super__Vector_base<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = sVar1.m_val;
  ::std::
  unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>::
  ~unique_ptr((unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
               *)&stack0xffffffffffffffd8);
  sVar2._8_8_ = extraout_RDX;
  sVar2.m_disk_io = &this->super_disk_interface;
  return sVar2;
}

Assistant:

storage_holder new_torrent(storage_params const& params
			, std::shared_ptr<void> const&) override
		{
			// make sure we can remove this torrent without causing a memory
			// allocation, by causing the allocation now instead
			storage_index_t const idx = m_free_slots.new_index(m_torrents.end_index());
			auto storage = std::make_unique<posix_storage>(params);
			if (idx == m_torrents.end_index()) m_torrents.emplace_back(std::move(storage));
			else m_torrents[idx] = std::move(storage);
			return storage_holder(idx, *this);
		}